

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

void __thiscall
tinyusdz::crate::CrateReader::CrateReader
          (CrateReader *this,StreamReader *sr,CrateReaderConfig *config)

{
  _Rb_tree_header *p_Var1;
  CrateReaderConfig *__dest;
  uint uVar2;
  vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_> *pvVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint __len;
  uint __val;
  string __str;
  ostringstream ss_w;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this->_version[0] = '\0';
  this->_version[1] = '\0';
  this->_version[2] = '\0';
  pvVar3 = &(this->_toc).sections;
  (pvVar3->super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar3->super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->_toc).sections.
    super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  *(undefined4 *)&this->_tokens_index = 0xffffffff;
  *(undefined4 *)((long)&this->_tokens_index + 4) = 0xffffffff;
  *(undefined4 *)&this->_paths_index = 0xffffffff;
  *(undefined4 *)((long)&this->_paths_index + 4) = 0xffffffff;
  *(undefined4 *)&this->_strings_index = 0xffffffff;
  *(undefined4 *)((long)&this->_strings_index + 4) = 0xffffffff;
  *(undefined4 *)&this->_fields_index = 0xffffffff;
  *(undefined4 *)((long)&this->_fields_index + 4) = 0xffffffff;
  *(undefined4 *)&this->_fieldsets_index = 0xffffffff;
  *(undefined4 *)((long)&this->_fieldsets_index + 4) = 0xffffffff;
  *(undefined4 *)&this->_specs_index = 0xffffffff;
  *(undefined4 *)((long)&this->_specs_index + 4) = 0xffffffff;
  p_Var1 = &(this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header;
  (this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&this->_tokens,0,0xc0);
  (this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_sr = sr;
  (this->_err)._M_dataplus._M_p = (pointer)&(this->_err).field_2;
  (this->_err)._M_string_length = 0;
  (this->_err).field_2._M_local_buf[0] = '\0';
  (this->_warn)._M_dataplus._M_p = (pointer)&(this->_warn).field_2;
  (this->_warn)._M_string_length = 0;
  (this->_warn).field_2._M_local_buf[0] = '\0';
  (this->unpackRecursionGuard)._M_h._M_buckets = &(this->unpackRecursionGuard)._M_h._M_single_bucket
  ;
  (this->unpackRecursionGuard)._M_h._M_bucket_count = 1;
  (this->unpackRecursionGuard)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->unpackRecursionGuard)._M_h._M_element_count = 0;
  (this->unpackRecursionGuard)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->unpackRecursionGuard)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  __dest = &this->_config;
  (this->_config).numThreads = -1;
  (this->_config).maxTOCSections = 0x20;
  (this->_config).maxNumTokens = 0x4000000;
  (this->_config).maxNumStrings = 0x4000000;
  (this->_config).maxNumFields = 0x10000000;
  (this->_config).maxNumFieldSets = 0x10000000;
  (this->_config).maxNumSpecifiers = 0x10000000;
  (this->_config).maxNumPaths = 0x10000000;
  (this->_config).maxNumIndices = 0x10000000;
  (this->_config).maxDictElements = 0x100;
  (this->_config).maxArrayElements = 0x40000000;
  (this->_config).maxAssetPathElements = 0x200;
  (this->_config).maxTokenLength = 0x1000;
  (this->_config).maxStringLength = 0x4000000;
  (this->_config).maxVariantsMapElements = 0x80;
  (this->_config).maxValueRecursion = 0x10;
  (this->_config).maxPathIndicesDecodeIteration = 0x10000000;
  (this->_config).maxInts = 0x40000000;
  (this->_config).maxMemoryBudget = 0x7fffffff;
  this->_memoryUsage = 0;
  this->_impl = (Impl *)0x0;
  memcpy(__dest,config,0x98);
  iVar5 = (this->_config).numThreads;
  if (iVar5 == -1) {
    iVar5 = ::std::thread::hardware_concurrency();
    __len = 1;
    if (iVar5 < 2) {
      iVar5 = 1;
    }
    __dest->numThreads = iVar5;
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"CrateReader",0xb);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"# of thread to use: ",0x14);
    uVar2 = __dest->numThreads;
    __val = -uVar2;
    if (0 < (int)uVar2) {
      __val = uVar2;
    }
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_001ac648;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_001ac648;
        }
        if (uVar7 < 10000) goto LAB_001ac648;
        uVar9 = uVar9 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_001ac648:
    local_1c8 = local_1b8;
    ::std::__cxx11::string::_M_construct((ulong)&local_1c8,(char)__len - (char)((int)uVar2 >> 0x1f))
    ;
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_1c8 + (ulong)(uVar2 >> 0x1f)),__len,__val);
    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_warn,(ulong)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    ::std::ios_base::~ios_base(local_138);
    iVar5 = __dest->numThreads;
  }
  iVar8 = 0x400;
  if (iVar5 < 0x400) {
    iVar8 = iVar5;
  }
  __dest->numThreads = iVar8;
  return;
}

Assistant:

CrateReader::CrateReader(StreamReader *sr, const CrateReaderConfig &config) : _sr(sr), _impl(nullptr) {
  _config = config;
  if (_config.numThreads == -1) {
#if defined(__wasi__)
#else
    _config.numThreads = (std::max)(1, int(std::thread::hardware_concurrency()));
    PUSH_WARN("# of thread to use: " << std::to_string(_config.numThreads));
#endif
  }


#if defined(__wasi__)
  PUSH_WARN("Threading is disabled for WASI build.");
  _config.numThreads = 1;
#else

  // Limit to 1024 threads.
  _config.numThreads = (std::min)(1024, _config.numThreads);
#endif

  //_impl = new Impl();

}